

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan_number(Lexer *this)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Token *in_RDI;
  
  uVar2 = (this->m_in)._M_len;
  if (this->pos < uVar2) {
    pcVar3 = (this->m_in)._M_str;
    uVar6 = this->pos;
    do {
      uVar5 = uVar6 + 1;
      bVar1 = pcVar3[uVar6];
      if (9 < (int)(char)bVar1 - 0x30U) {
        if (bVar1 < 0x2e) {
          if (bVar1 == 0x2b) {
            if (uVar5 != 1) {
              bVar1 = pcVar3[uVar6 - 1];
              goto joined_r0x00164156;
            }
          }
          else {
            if (bVar1 != 0x2d) break;
            if (uVar5 != 1) {
              bVar1 = pcVar3[uVar6 - 1];
joined_r0x00164156:
              bVar1 = bVar1 | 0x20;
              goto joined_r0x00164156;
            }
          }
        }
        else if ((bVar1 != 0x2e) && (bVar1 != 0x45)) {
joined_r0x00164156:
          if (bVar1 != 0x65) break;
        }
      }
      this->pos = uVar5;
      uVar6 = uVar5;
    } while (uVar5 != uVar2);
  }
  uVar6 = this->tok_start;
  if (uVar2 < this->tok_start) {
    uVar6 = uVar2;
  }
  uVar5 = this->pos;
  if (this->pos < uVar6) {
    uVar5 = uVar6;
  }
  if (uVar2 <= uVar5) {
    uVar5 = uVar2;
  }
  uVar4 = uVar2 - uVar6;
  if (uVar5 - uVar6 <= uVar2 - uVar6) {
    uVar4 = uVar5 - uVar6;
  }
  pcVar3 = (this->m_in)._M_str;
  in_RDI->kind = Number;
  (in_RDI->text)._M_len = uVar4;
  (in_RDI->text)._M_str = pcVar3 + uVar6;
  return in_RDI;
}

Assistant:

Token scan_number() {
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos];
      // be very permissive in lexer (we'll catch errors when conversion happens)
      if (!(std::isdigit(ch) || ch == '.' || ch == 'e' || ch == 'E' || (ch == '+' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')) || (ch == '-' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')))) {
        break;
      }
      pos += 1;
    }
    return make_token(Token::Kind::Number);
  }